

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.cpp
# Opt level: O0

void __thiscall
libtorrent::chained_buffer::build_vec<libtorrent::span<char>>
          (chained_buffer *this,int bytes,
          vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_> *vec)

{
  pointer pbVar1;
  pointer pbVar2;
  bool local_79;
  unsigned_long local_70;
  unsigned_long local_68;
  undefined1 local_60 [8];
  iterator end;
  iterator i;
  vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_> *vec_local;
  int bytes_local;
  chained_buffer *this_local;
  
  std::
  deque<libtorrent::chained_buffer::buffer_t,_std::allocator<libtorrent::chained_buffer::buffer_t>_>
  ::begin((iterator *)&end._M_node,&this->m_vec);
  std::
  deque<libtorrent::chained_buffer::buffer_t,_std::allocator<libtorrent::chained_buffer::buffer_t>_>
  ::end((iterator *)local_60,&this->m_vec);
  vec_local._4_4_ = bytes;
  while( true ) {
    local_79 = false;
    if (0 < vec_local._4_4_) {
      local_79 = std::operator!=((_Self *)&end._M_node,(_Self *)local_60);
    }
    if (local_79 == false) break;
    pbVar1 = std::
             _Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
             ::operator->((_Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
                           *)&end._M_node);
    if (vec_local._4_4_ < pbVar1->used_size) {
      pbVar1 = std::
               _Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
               ::operator->((_Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
                             *)&end._M_node);
      local_68 = (unsigned_long)vec_local._4_4_;
      std::vector<libtorrent::span<char>,std::allocator<libtorrent::span<char>>>::
      emplace_back<char*&,unsigned_long>
                ((vector<libtorrent::span<char>,std::allocator<libtorrent::span<char>>> *)vec,
                 &pbVar1->buf,&local_68);
      return;
    }
    pbVar1 = std::
             _Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
             ::operator->((_Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
                           *)&end._M_node);
    pbVar2 = std::
             _Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
             ::operator->((_Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
                           *)&end._M_node);
    local_70 = (unsigned_long)pbVar2->used_size;
    std::vector<libtorrent::span<char>,std::allocator<libtorrent::span<char>>>::
    emplace_back<char*&,unsigned_long>
              ((vector<libtorrent::span<char>,std::allocator<libtorrent::span<char>>> *)vec,
               &pbVar1->buf,&local_70);
    pbVar1 = std::
             _Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
             ::operator->((_Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
                           *)&end._M_node);
    vec_local._4_4_ = vec_local._4_4_ - pbVar1->used_size;
    std::
    _Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
    ::operator++((_Deque_iterator<libtorrent::chained_buffer::buffer_t,_libtorrent::chained_buffer::buffer_t_&,_libtorrent::chained_buffer::buffer_t_*>
                  *)&end._M_node);
  }
  return;
}

Assistant:

void chained_buffer::build_vec(int bytes, std::vector<Buffer>& vec)
	{
		TORRENT_ASSERT(!m_destructed);
		for (auto i = m_vec.begin(), end(m_vec.end()); bytes > 0 && i != end; ++i)
		{
			TORRENT_ASSERT(i->buf != nullptr);
			if (i->used_size > bytes)
			{
				TORRENT_ASSERT(bytes > 0);
				vec.emplace_back(i->buf, std::size_t(bytes));
				break;
			}
			TORRENT_ASSERT(i->used_size > 0);
			vec.emplace_back(i->buf, std::size_t(i->used_size));
			bytes -= i->used_size;
		}
	}